

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskDirectory::tryOpenSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX_00;
  Directory *pDVar2;
  WriteMode in_R8D;
  size_t *this_00;
  PathPtr path_00;
  PathPtr path_01;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar3;
  NullableValue<kj::OwnFd> local_40;
  Own<kj::Directory,_std::nullptr_t> local_38;
  Directory *extraout_RDX;
  
  path_00.parts.size_._4_4_ = in_register_0000000c;
  path_00.parts.size_._0_4_ = mode;
  path_01.parts.size_ = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  if ((in_R8D & CREATE) != 0) {
    path_00.parts.ptr = path_01.parts.size_;
    bVar1 = DiskHandle::tryMkdir((DiskHandle *)this_00,path_00,in_R8D,false);
    if (!bVar1) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      *(undefined8 *)&this->super_DiskHandle = 0;
      pDVar2 = extraout_RDX;
      goto LAB_001dcbd8;
    }
  }
  path_01.parts.ptr = (String *)this_00;
  DiskHandle::tryOpenSubdirInternal((DiskHandle *)&local_40,path_01);
  Maybe<kj::OwnFd>::map<kj::Own<kj::Directory,_std::nullptr_t>_(&)(kj::OwnFd)>
            ((Maybe<kj::OwnFd> *)&local_38,
             (_func_Own<kj::Directory,_std::nullptr_t>_OwnFd *)&local_40);
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)local_38.disposer;
  *(Directory **)&this->super_DiskHandle = local_38.ptr;
  local_38.ptr = (Directory *)0x0;
  Own<kj::Directory,_std::nullptr_t>::dispose(&local_38);
  kj::_::NullableValue<kj::OwnFd>::~NullableValue(&local_40);
  pDVar2 = extraout_RDX_00;
LAB_001dcbd8:
  MVar3.ptr.ptr = pDVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenSubdir(path, mode);
  }